

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O3

void add_noise_to_block_hbd
               (aom_film_grain_t *params,uint16_t *luma,uint16_t *cb,uint16_t *cr,int luma_stride,
               int chroma_stride,int *luma_grain,int *cb_grain,int *cr_grain,int luma_grain_stride,
               int chroma_grain_stride,int half_luma_height,int half_luma_width,int bit_depth,
               int chroma_subsamp_y,int chroma_subsamp_x,int mc_identity)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  int local_d8;
  int local_d4;
  int local_d0;
  uint16_t *local_c8;
  uint16_t *local_c0;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_90;
  int *local_78;
  int *local_70;
  
  bVar12 = (byte)bit_depth - 8;
  local_d8 = 1 << ((byte)bit_depth & 0x1f);
  bVar4 = (byte)params->scaling_shift;
  iVar15 = 1 << (bVar4 - 1 & 0x1f);
  bVar22 = true;
  if (params->num_cb_points < 1) {
    bVar22 = params->chroma_scaling_from_luma != 0;
  }
  iVar8 = params->num_cr_points;
  bVar23 = params->chroma_scaling_from_luma == 0;
  if (bVar23) {
    local_b0 = params->cb_mult + -0x80;
    local_ac = params->cb_luma_mult + -0x80;
    local_d4 = (params->cb_offset << (bVar12 & 0x1f)) - local_d8;
    local_a8 = params->cr_mult + -0x80;
    local_a4 = params->cr_luma_mult + -0x80;
    local_d8 = (params->cr_offset << (bVar12 & 0x1f)) - local_d8;
  }
  else {
    local_d8 = 0;
    local_a4 = 0x40;
    local_a8 = 0;
    local_d4 = 0;
    local_ac = 0x40;
    local_b0 = 0;
  }
  if (params->clip_to_restricted_range == 0) {
    local_d0 = (0x100 << (bVar12 & 0x1f)) + -1;
    iVar18 = 0;
    iVar9 = local_d0;
  }
  else {
    iVar18 = 0x10 << (bVar12 & 0x1f);
    local_d0 = 0xeb << (bVar12 & 0x1f);
    iVar9 = 0xf0 << (bVar12 & 0x1f);
    if (mc_identity != 0) {
      iVar9 = local_d0;
    }
  }
  iVar2 = params->num_y_points;
  bVar3 = 1 - (byte)chroma_subsamp_y & 0x1f;
  uVar13 = (uint16_t)iVar18;
  if (0 < half_luma_height << bVar3) {
    local_70 = cr_grain;
    local_78 = cb_grain;
    uVar17 = half_luma_width << (1U - (char)chroma_subsamp_x & 0x1f);
    iVar16 = (0x100 << (bVar12 & 0x1f)) + -1;
    local_90 = 0;
    local_c8 = cb;
    local_c0 = cr;
    do {
      if (0 < (int)uVar17) {
        iVar5 = ((int)local_90 << ((byte)chroma_subsamp_y & 0x1f)) * luma_stride;
        lVar20 = 0;
        do {
          if (chroma_subsamp_x == 0) {
            uVar19 = (uint)*(ushort *)((long)luma + lVar20 + (long)iVar5 * 2);
          }
          else {
            lVar10 = (long)(iVar5 + (int)lVar20);
            uVar19 = (uint)luma[lVar10 + 1] + (uint)luma[lVar10] + 1 >> 1 & 0xffff;
          }
          if (bVar22) {
            uVar1 = *(ushort *)((long)local_c8 + lVar20);
            iVar6 = ((int)(local_b0 * (uint)uVar1 + uVar19 * local_ac) >> 6) + local_d4;
            iVar7 = iVar6;
            if (iVar16 <= iVar6) {
              iVar7 = iVar16;
            }
            if (iVar6 < 0) {
              iVar7 = 0;
            }
            iVar7 = scale_LUT(scaling_lut_cb,iVar7,bit_depth);
            iVar6 = (iVar7 * *(int *)((long)local_78 + lVar20 * 2) + iVar15 >> (bVar4 & 0x1f)) +
                    (uint)uVar1;
            iVar7 = iVar6;
            if (iVar9 <= iVar6) {
              iVar7 = iVar9;
            }
            uVar14 = uVar13;
            if (iVar18 <= iVar6) {
              uVar14 = (uint16_t)iVar7;
            }
            *(uint16_t *)((long)local_c8 + lVar20) = uVar14;
          }
          if (0 < iVar8 || !bVar23) {
            uVar1 = *(ushort *)((long)local_c0 + lVar20);
            iVar6 = ((int)(local_a8 * (uint)uVar1 + uVar19 * local_a4) >> 6) + local_d8;
            iVar7 = iVar6;
            if (iVar16 <= iVar6) {
              iVar7 = iVar16;
            }
            if (iVar6 < 0) {
              iVar7 = 0;
            }
            iVar7 = scale_LUT(scaling_lut_cr,iVar7,bit_depth);
            iVar6 = (iVar7 * *(int *)((long)local_70 + lVar20 * 2) + iVar15 >> (bVar4 & 0x1f)) +
                    (uint)uVar1;
            iVar7 = iVar6;
            if (iVar9 <= iVar6) {
              iVar7 = iVar9;
            }
            uVar14 = uVar13;
            if (iVar18 <= iVar6) {
              uVar14 = (uint16_t)iVar7;
            }
            *(uint16_t *)((long)local_c0 + lVar20) = uVar14;
          }
          lVar20 = lVar20 + 2;
        } while ((ulong)uVar17 * 2 != lVar20);
      }
      local_90 = local_90 + 1;
      local_70 = local_70 + chroma_grain_stride;
      local_c0 = local_c0 + chroma_stride;
      local_78 = local_78 + chroma_grain_stride;
      local_c8 = local_c8 + chroma_stride;
    } while (local_90 != (uint)(half_luma_height << bVar3));
  }
  if ((0 < iVar2) && (0 < half_luma_height * 2)) {
    uVar11 = 0;
    do {
      if (0 < half_luma_width * 2) {
        uVar21 = 0;
        do {
          uVar1 = luma[uVar21];
          iVar8 = scale_LUT(scaling_lut_y,(uint)uVar1,bit_depth);
          iVar9 = (iVar8 * luma_grain[uVar21] + iVar15 >> (bVar4 & 0x1f)) + (uint)uVar1;
          iVar8 = iVar9;
          if (local_d0 <= iVar9) {
            iVar8 = local_d0;
          }
          uVar14 = uVar13;
          if (iVar18 <= iVar9) {
            uVar14 = (uint16_t)iVar8;
          }
          luma[uVar21] = uVar14;
          uVar21 = uVar21 + 1;
        } while ((uint)(half_luma_width * 2) != uVar21);
      }
      uVar11 = uVar11 + 1;
      luma_grain = luma_grain + luma_grain_stride;
      luma = luma + luma_stride;
    } while (uVar11 != (uint)(half_luma_height * 2));
  }
  return;
}

Assistant:

static void add_noise_to_block_hbd(
    const aom_film_grain_t *params, uint16_t *luma, uint16_t *cb, uint16_t *cr,
    int luma_stride, int chroma_stride, int *luma_grain, int *cb_grain,
    int *cr_grain, int luma_grain_stride, int chroma_grain_stride,
    int half_luma_height, int half_luma_width, int bit_depth,
    int chroma_subsamp_y, int chroma_subsamp_x, int mc_identity) {
  int cb_mult = params->cb_mult - 128;            // fixed scale
  int cb_luma_mult = params->cb_luma_mult - 128;  // fixed scale
  // offset value depends on the bit depth
  int cb_offset = (params->cb_offset << (bit_depth - 8)) - (1 << bit_depth);

  int cr_mult = params->cr_mult - 128;            // fixed scale
  int cr_luma_mult = params->cr_luma_mult - 128;  // fixed scale
  // offset value depends on the bit depth
  int cr_offset = (params->cr_offset << (bit_depth - 8)) - (1 << bit_depth);

  int rounding_offset = (1 << (params->scaling_shift - 1));

  int apply_y = params->num_y_points > 0 ? 1 : 0;
  int apply_cb =
      (params->num_cb_points > 0 || params->chroma_scaling_from_luma) > 0 ? 1
                                                                          : 0;
  int apply_cr =
      (params->num_cr_points > 0 || params->chroma_scaling_from_luma) > 0 ? 1
                                                                          : 0;

  if (params->chroma_scaling_from_luma) {
    cb_mult = 0;        // fixed scale
    cb_luma_mult = 64;  // fixed scale
    cb_offset = 0;

    cr_mult = 0;        // fixed scale
    cr_luma_mult = 64;  // fixed scale
    cr_offset = 0;
  }

  int min_luma, max_luma, min_chroma, max_chroma;

  if (params->clip_to_restricted_range) {
    min_luma = min_luma_legal_range << (bit_depth - 8);
    max_luma = max_luma_legal_range << (bit_depth - 8);

    if (mc_identity) {
      min_chroma = min_luma_legal_range << (bit_depth - 8);
      max_chroma = max_luma_legal_range << (bit_depth - 8);
    } else {
      min_chroma = min_chroma_legal_range << (bit_depth - 8);
      max_chroma = max_chroma_legal_range << (bit_depth - 8);
    }
  } else {
    min_luma = min_chroma = 0;
    max_luma = max_chroma = (256 << (bit_depth - 8)) - 1;
  }

  for (int i = 0; i < (half_luma_height << (1 - chroma_subsamp_y)); i++) {
    for (int j = 0; j < (half_luma_width << (1 - chroma_subsamp_x)); j++) {
      int average_luma = 0;
      if (chroma_subsamp_x) {
        average_luma = (luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x)] +
                        luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x) + 1] +
                        1) >>
                       1;
      } else {
        average_luma = luma[(i << chroma_subsamp_y) * luma_stride + j];
      }

      if (apply_cb) {
        cb[i * chroma_stride + j] = clamp(
            cb[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cb,
                            clamp(((average_luma * cb_luma_mult +
                                    cb_mult * cb[i * chroma_stride + j]) >>
                                   6) +
                                      cb_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            bit_depth) *
                      cb_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
      if (apply_cr) {
        cr[i * chroma_stride + j] = clamp(
            cr[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cr,
                            clamp(((average_luma * cr_luma_mult +
                                    cr_mult * cr[i * chroma_stride + j]) >>
                                   6) +
                                      cr_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            bit_depth) *
                      cr_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
    }
  }

  if (apply_y) {
    for (int i = 0; i < (half_luma_height << 1); i++) {
      for (int j = 0; j < (half_luma_width << 1); j++) {
        luma[i * luma_stride + j] =
            clamp(luma[i * luma_stride + j] +
                      ((scale_LUT(scaling_lut_y, luma[i * luma_stride + j],
                                  bit_depth) *
                            luma_grain[i * luma_grain_stride + j] +
                        rounding_offset) >>
                       params->scaling_shift),
                  min_luma, max_luma);
      }
    }
  }
}